

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O1

double __thiscall webrtc::Histogram::CurrentRms(Histogram *this)

{
  long lVar1;
  double dVar2;
  
  if (0 < this->audio_content_q10_) {
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + (double)*(long *)((long)this->bin_count_q10_ + lVar1) *
                      (1.0 / (double)this->audio_content_q10_) *
                      *(double *)((long)&kHistBinCenters + lVar1);
      lVar1 = lVar1 + 8;
    } while (lVar1 != 0x268);
    return dVar2;
  }
  return 0.0759621091765857;
}

Assistant:

double Histogram::CurrentRms() const {
  double p;
  double mean_val = 0;
  if (audio_content_q10_ > 0) {
    double p_total_inverse = 1. / static_cast<double>(audio_content_q10_);
    for (int n = 0; n < kHistSize; n++) {
      p = static_cast<double>(bin_count_q10_[n]) * p_total_inverse;
      mean_val += p * kHistBinCenters[n];
    }
  } else {
    mean_val = kHistBinCenters[0];
  }
  return mean_val;
}